

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O0

void __thiscall jbcoin::ValidatorKeys::writeToFile(ValidatorKeys *this,path *keyFile)

{
  bool bVar1;
  byte bVar2;
  char *value;
  Value *pVVar3;
  string *psVar4;
  runtime_error *prVar5;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  byte local_454;
  string local_3f0;
  undefined1 local_3c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  ofstream o;
  path local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  byte local_159;
  path local_158;
  path local_138;
  path local_118;
  undefined1 local_f8 [8];
  error_code ec;
  Value local_c8;
  Value local_b8;
  string local_a8;
  Value local_88;
  string local_78;
  Value local_58 [2];
  Value local_38;
  undefined1 local_28 [8];
  Value jv;
  path *keyFile_local;
  ValidatorKeys *this_local;
  
  jv._8_8_ = keyFile;
  Json::Value::Value((Value *)local_28,nullValue);
  value = to_string(this->keyType_);
  Json::Value::Value(&local_38,value);
  pVVar3 = Json::Value::operator[]((Value *)local_28,"key_type");
  Json::Value::operator=(pVVar3,&local_38);
  Json::Value::~Value(&local_38);
  toBase58_abi_cxx11_(&local_78,(jbcoin *)0x1c,(int)this + 8,
                      (PublicKey *)CONCAT71(in_register_00000009,in_CL));
  Json::Value::Value(local_58,&local_78);
  pVVar3 = Json::Value::operator[]((Value *)local_28,"public_key");
  Json::Value::operator=(pVVar3,local_58);
  Json::Value::~Value(local_58);
  std::__cxx11::string::~string((string *)&local_78);
  toBase58_abi_cxx11_(&local_a8,(jbcoin *)&DAT_00000020,(int)this + 0x38,
                      (SecretKey *)CONCAT71(in_register_00000009,in_CL));
  Json::Value::Value(&local_88,&local_a8);
  pVVar3 = Json::Value::operator[]((Value *)local_28,"secret_key");
  Json::Value::operator=(pVVar3,&local_88);
  Json::Value::~Value(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  Json::Value::Value(&local_b8,this->tokenSequence_);
  pVVar3 = Json::Value::operator[]((Value *)local_28,"token_sequence");
  Json::Value::operator=(pVVar3,&local_b8);
  Json::Value::~Value(&local_b8);
  Json::Value::Value(&local_c8,(bool)(this->revoked_ & 1));
  pVVar3 = Json::Value::operator[]((Value *)local_28,"revoked");
  Json::Value::operator=(pVVar3,&local_c8);
  Json::Value::~Value(&local_c8);
  boost::filesystem::path::parent_path();
  bVar1 = boost::filesystem::path::empty((path *)&ec.cat_);
  boost::filesystem::path::~path((path *)&ec.cat_);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    boost::system::error_code::error_code((error_code *)local_f8);
    boost::filesystem::path::parent_path();
    bVar1 = boost::filesystem::exists(&local_118);
    boost::filesystem::path::~path(&local_118);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      boost::filesystem::path::parent_path();
      boost::filesystem::create_directories(&local_138,(error_code *)local_f8);
      boost::filesystem::path::~path(&local_138);
    }
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_f8);
    local_159 = 0;
    local_454 = 1;
    if (!bVar1) {
      boost::filesystem::path::parent_path();
      local_159 = 1;
      bVar1 = boost::filesystem::is_directory(&local_158);
      local_454 = bVar1 ^ 0xff;
    }
    if ((local_159 & 1) != 0) {
      boost::filesystem::path::~path(&local_158);
    }
    if ((local_454 & 1) != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      boost::filesystem::path::parent_path();
      psVar4 = boost::filesystem::path::string_abi_cxx11_(&local_1a0);
      std::operator+(&local_180,"Cannot create directory: ",psVar4);
      std::runtime_error::runtime_error(prVar5,(string *)&local_180);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  psVar4 = boost::filesystem::path::string_abi_cxx11_((path *)jv._8_8_);
  std::ofstream::ofstream(local_3a8,(string *)psVar4,_S_trunc);
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) != 0) {
    local_3c9 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    psVar4 = boost::filesystem::path::string_abi_cxx11_((path *)jv._8_8_);
    std::operator+(&local_3c8,"Cannot open key file: ",psVar4);
    std::runtime_error::runtime_error(prVar5,(string *)&local_3c8);
    local_3c9 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Json::Value::toStyledString_abi_cxx11_(&local_3f0,(Value *)local_28);
  std::operator<<((ostream *)local_3a8,(string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::ofstream::~ofstream(local_3a8);
  Json::Value::~Value((Value *)local_28);
  return;
}

Assistant:

void
ValidatorKeys::writeToFile (
    boost::filesystem::path const& keyFile) const
{
    using namespace boost::filesystem;

    Json::Value jv;
    jv["key_type"] = to_string(keyType_);
    jv["public_key"] = toBase58(TOKEN_NODE_PUBLIC, publicKey_);
    jv["secret_key"] = toBase58(TOKEN_NODE_PRIVATE, secretKey_);
    jv["token_sequence"] = Json::UInt (tokenSequence_);
    jv["revoked"] = revoked_;

    if (! keyFile.parent_path().empty())
    {
        boost::system::error_code ec;
        if (! exists (keyFile.parent_path()))
            boost::filesystem::create_directories(keyFile.parent_path(), ec);

        if (ec || ! is_directory (keyFile.parent_path()))
            throw std::runtime_error ("Cannot create directory: " +
                    keyFile.parent_path().string());
    }

    std::ofstream o (keyFile.string (), std::ios_base::trunc);
    if (o.fail())
        throw std::runtime_error ("Cannot open key file: " +
            keyFile.string());

    o << jv.toStyledString();
}